

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_line_ex(rf_vec2 start_pos,rf_vec2 end_pos,float thick,rf_color color)

{
  float x;
  float y;
  float x_00;
  float fVar1;
  float fVar2;
  uint local_40;
  
  x = end_pos.x;
  y = end_pos.y;
  if (start_pos.x <= x) {
    x = start_pos.x;
    y = start_pos.y;
    start_pos = end_pos;
  }
  fVar1 = start_pos.x - x;
  fVar2 = start_pos.y - y;
  x_00 = SQRT(fVar1 * fVar1 + fVar2 * fVar2);
  fVar1 = asinf(fVar2 / x_00);
  rf_get_shapes_texture();
  rf_gfx_enable_texture(local_40);
  rf_gfx_push_matrix();
  rf_gfx_translatef(x,y,0.0);
  rf_gfx_rotatef(fVar1 * 57.295776,0.0,0.0,1.0);
  rf_gfx_translatef(0.0,(float)(~-(uint)(1.0 < thick) & 0xbf800000 |
                               (uint)(thick * -0.5) & -(uint)(1.0 < thick)),0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(0.0,0.0);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(0.0,thick);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(x_00,thick);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(x_00,0.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_line_ex(rf_vec2 start_pos, rf_vec2 end_pos, float thick, rf_color color)
{
    if (start_pos.x > end_pos.x)
    {
        rf_vec2 temp_pos = start_pos;
        start_pos = end_pos;
        end_pos = temp_pos;
    }

    float dx = end_pos.x - start_pos.x;
    float dy = end_pos.y - start_pos.y;

    float d = sqrtf(dx*dx + dy*dy);
    float angle = asinf(dy/d);

    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_translatef((float)start_pos.x, (float)start_pos.y, 0.0f);
    rf_gfx_rotatef(RF_RAD2DEG * angle, 0.0f, 0.0f, 1.0f);
    rf_gfx_translatef(0, (thick > 1.0f)? -thick/2.0f : -1.0f, 0.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, 0.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, 0.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}